

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcp.cc
# Opt level: O2

int main(int argc,char **argv)

{
  uint16_t port;
  pointer pHVar1;
  Log *pLVar2;
  ulong uVar3;
  long lVar4;
  vector<common::Host,_std::allocator<common::Host>_> hosts;
  string local_388;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  Config config;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  XcpOptions options;
  SSH2Client client;
  
  XcpOptions::XcpOptions(&options);
  XcpOptions::Init(&options,argc,argv);
  if (options.super_Options.log_file._M_string_length != 0) {
    pLVar2 = xlib::Log::Instance();
    std::__cxx11::string::string((string *)&local_348,(string *)&options.super_Options.log_file);
    xlib::Log::SetLogFile(pLVar2,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
  }
  if (0 < options.super_Options.log_level) {
    pLVar2 = xlib::Log::Instance();
    xlib::Log::SetLogPriority(pLVar2,options.super_Options.log_level);
  }
  config.m_group_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  config.m_group_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  config.m_hosts.
  super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  config.m_group_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  config.m_hosts.
  super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  config.m_hosts.
  super__Vector_base<std::shared_ptr<common::Host>,_std::allocator<std::shared_ptr<common::Host>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  common::Config::Init(&config,&options.super_Options.config_file);
  hosts.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hosts.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hosts.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  common::Config::GetHostsByOptions(&config,&options.super_Options,&hosts);
  lVar4 = 0x40;
  uVar3 = 0;
  while( true ) {
    pHVar1 = hosts.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)hosts.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)hosts.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0xc0) <= uVar3) break;
    std::__cxx11::string::string
              ((string *)&local_308,
               (string *)
               ((long)hosts.super__Vector_base<common::Host,_std::allocator<common::Host>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar4 + -0x20));
    std::__cxx11::string::string
              ((string *)&local_328,(string *)((long)&(pHVar1->alias)._M_dataplus._M_p + lVar4));
    std::__cxx11::string::string
              ((string *)&local_388,(string *)((long)&(pHVar1->user)._M_dataplus._M_p + lVar4));
    port = *(uint16_t *)((long)&(pHVar1->password)._M_dataplus._M_p + lVar4);
    std::__cxx11::string::string((string *)&local_368,(string *)((long)pHVar1 + lVar4 + -0x40));
    common::SSH2Client::SSH2Client(&client,&local_308,&local_328,&local_388,port,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_328);
    std::__cxx11::string::~string((string *)&local_308);
    common::SSH2Client::Open(&client,true);
    if (options.remote_to_local == true) {
      std::__cxx11::string::string((string *)&local_250,(string *)&options.local_path);
      std::__cxx11::string::string((string *)&local_270,(string *)&options.remote_path);
      common::SSH2Client::Copy(&client,&local_250,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_250);
    }
    if (options.local_to_remote == true) {
      std::__cxx11::string::string((string *)&local_290,(string *)&options.local_path);
      std::__cxx11::string::string((string *)&local_2b0,(string *)&options.remote_path);
      common::SSH2Client::Send(&client,&local_290,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_290);
    }
    common::SSH2Client::~SSH2Client(&client);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0xc0;
  }
  std::vector<common::Host,_std::allocator<common::Host>_>::~vector(&hosts);
  common::Config::~Config(&config);
  XcpOptions::~XcpOptions(&options);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    XcpOptions options;
    options.Init(argc, argv);

    if (options.log_file.empty() == false) {
        xlib::Log::Instance().SetLogFile(options.log_file);
    }
    if (options.log_level > 0) {
        xlib::Log::Instance().SetLogPriority(xlib::LOG_PRIORITY(options.log_level));
    }

    common::Config config;
    config.Init(options.config_file);

    std::vector<common::Host> hosts;
    config.GetHostsByOptions(options, &hosts);
    for (size_t i = 0; i < hosts.size(); i++) {
        common::Host& host = hosts[i];
        common::SSH2Client client(
            host.user, host.password, host.ip, host.port, host.alias);
        client.Open();
        if (options.remote_to_local) {
            client.Copy(options.local_path, options.remote_path);
        }
        if (options.local_to_remote) {
            client.Send(options.local_path, options.remote_path);
        }
    }
    return 0;
}